

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O0

mz_zip_error mz_zip_get_last_error(mz_zip_archive *pZip)

{
  mz_zip_error prev_err;
  mz_zip_archive *pZip_local;
  
  if (pZip == (mz_zip_archive *)0x0) {
    pZip_local._4_4_ = MZ_ZIP_INVALID_PARAMETER;
  }
  else {
    pZip_local._4_4_ = pZip->m_last_error;
    pZip->m_last_error = MZ_ZIP_NO_ERROR;
  }
  return pZip_local._4_4_;
}

Assistant:

mz_zip_error mz_zip_get_last_error(mz_zip_archive *pZip)
{
    mz_zip_error prev_err;

    if (!pZip)
        return MZ_ZIP_INVALID_PARAMETER;

    prev_err = pZip->m_last_error;

    pZip->m_last_error = MZ_ZIP_NO_ERROR;
    return prev_err;
}